

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

void * XML_GetBuffer(XML_Parser parser,int len)

{
  XML_Parsing XVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  
  if (parser == (XML_Parser)0x0) {
    return (void *)0x0;
  }
  if (len < 0) goto LAB_005f5545;
  XVar1 = (parser->m_parsingStatus).parsing;
  if (XVar1 == XML_FINISHED) {
    parser->m_errorCode = XML_ERROR_FINISHED;
    return (void *)0x0;
  }
  if (XVar1 == XML_SUSPENDED) {
    parser->m_errorCode = XML_ERROR_SUSPENDED;
    return (void *)0x0;
  }
  pcVar5 = parser->m_bufferLim;
  if ((pcVar5 == (char *)0x0) || (parser->m_bufferEnd == (char *)0x0)) {
    lVar8 = 0;
  }
  else {
    lVar8 = (long)pcVar5 - (long)parser->m_bufferEnd;
  }
  if ((long)(ulong)(uint)len <= lVar8) goto LAB_005f56a3;
  pcVar2 = parser->m_bufferEnd;
  iVar10 = 0;
  if ((pcVar2 != (char *)0x0) && (iVar10 = 0, parser->m_bufferPtr != (char *)0x0)) {
    iVar10 = (int)pcVar2 - (int)parser->m_bufferPtr;
  }
  uVar11 = iVar10 + len;
  if ((int)uVar11 < 0) {
LAB_005f5545:
    parser->m_errorCode = XML_ERROR_NO_MEMORY;
    return (void *)0x0;
  }
  pcVar3 = parser->m_bufferPtr;
  iVar6 = (int)pcVar3;
  iVar10 = 0;
  if ((pcVar3 != (char *)0x0) && (iVar10 = 0, parser->m_buffer != (char *)0x0)) {
    iVar10 = iVar6 - (int)parser->m_buffer;
  }
  iVar9 = 0x400;
  if (iVar10 < 0x400) {
    iVar9 = iVar10;
  }
  if ((int)(uVar11 ^ 0x7fffffff) < iVar9) goto LAB_005f5545;
  if ((pcVar5 == (char *)0x0) || (parser->m_buffer == (char *)0x0)) {
    lVar8 = 0;
  }
  else {
    lVar8 = (long)pcVar5 - (long)parser->m_buffer;
  }
  if (lVar8 < (int)(uVar11 + iVar9)) {
    uVar7 = (int)pcVar5 - iVar6;
    if (pcVar3 == (char *)0x0) {
      uVar7 = 0;
    }
    if (pcVar5 == (char *)0x0) {
      uVar7 = 0;
    }
    uVar4 = 0x400;
    if (uVar7 != 0) {
      uVar4 = uVar7;
    }
    do {
      uVar4 = uVar4 * 2;
      if ((int)(uVar11 + iVar9) <= (int)uVar4) break;
    } while (0 < (int)uVar4);
    if ((int)uVar4 < 1) goto LAB_005f5545;
    pcVar5 = (char *)(*(parser->m_mem).malloc_fcn)((ulong)uVar4);
    if (pcVar5 == (char *)0x0) goto LAB_005f5545;
    parser->m_bufferLim = pcVar5 + uVar4;
    pcVar2 = parser->m_bufferPtr;
    if (pcVar2 == (char *)0x0) {
      parser->m_bufferEnd = pcVar5;
      parser->m_buffer = pcVar5;
    }
    else {
      lVar8 = (long)parser->m_bufferEnd - (long)pcVar2;
      if (parser->m_bufferEnd == (char *)0x0) {
        lVar8 = 0;
      }
      memcpy(pcVar5,pcVar2 + -iVar9,lVar8 + iVar9);
      (*(parser->m_mem).free_fcn)(parser->m_buffer);
      parser->m_buffer = pcVar5;
      if ((parser->m_bufferEnd == (char *)0x0) || (parser->m_bufferPtr == (char *)0x0)) {
        lVar8 = 0;
      }
      else {
        lVar8 = (long)parser->m_bufferEnd - (long)parser->m_bufferPtr;
      }
      pcVar5 = pcVar5 + iVar9;
      parser->m_bufferEnd = pcVar5 + lVar8;
    }
LAB_005f568a:
    parser->m_bufferPtr = pcVar5;
  }
  else {
    if ((pcVar3 == (char *)0x0) || (parser->m_buffer == (char *)0x0)) {
      lVar8 = 0;
    }
    else {
      lVar8 = (long)pcVar3 - (long)parser->m_buffer;
    }
    if (iVar9 < lVar8) {
      iVar10 = 0;
      if ((pcVar3 != (char *)0x0) && (iVar10 = 0, parser->m_buffer != (char *)0x0)) {
        iVar10 = iVar6 - (int)parser->m_buffer;
      }
      lVar8 = (long)(iVar10 - iVar9);
      memmove(parser->m_buffer,parser->m_buffer + lVar8,
              (size_t)(pcVar2 + ((long)iVar9 - (long)pcVar3)));
      parser->m_bufferEnd = parser->m_bufferEnd + -lVar8;
      pcVar5 = parser->m_bufferPtr + -lVar8;
      goto LAB_005f568a;
    }
  }
  parser->m_eventPtr = (char *)0x0;
  parser->m_eventEndPtr = (char *)0x0;
  parser->m_positionPtr = (char *)0x0;
LAB_005f56a3:
  return parser->m_bufferEnd;
}

Assistant:

void *XMLCALL
XML_GetBuffer(XML_Parser parser, int len) {
  if (parser == NULL)
    return NULL;
  if (len < 0) {
    parser->m_errorCode = XML_ERROR_NO_MEMORY;
    return NULL;
  }
  switch (parser->m_parsingStatus.parsing) {
  case XML_SUSPENDED:
    parser->m_errorCode = XML_ERROR_SUSPENDED;
    return NULL;
  case XML_FINISHED:
    parser->m_errorCode = XML_ERROR_FINISHED;
    return NULL;
  default:;
  }

  if (len > EXPAT_SAFE_PTR_DIFF(parser->m_bufferLim, parser->m_bufferEnd)) {
#ifdef XML_CONTEXT_BYTES
    int keep;
#endif /* defined XML_CONTEXT_BYTES */
    /* Do not invoke signed arithmetic overflow: */
    int neededSize = (int)((unsigned)len
                           + (unsigned)EXPAT_SAFE_PTR_DIFF(
                               parser->m_bufferEnd, parser->m_bufferPtr));
    if (neededSize < 0) {
      parser->m_errorCode = XML_ERROR_NO_MEMORY;
      return NULL;
    }
#ifdef XML_CONTEXT_BYTES
    keep = (int)EXPAT_SAFE_PTR_DIFF(parser->m_bufferPtr, parser->m_buffer);
    if (keep > XML_CONTEXT_BYTES)
      keep = XML_CONTEXT_BYTES;
    /* Detect and prevent integer overflow */
    if (keep > INT_MAX - neededSize) {
      parser->m_errorCode = XML_ERROR_NO_MEMORY;
      return NULL;
    }
    neededSize += keep;
#endif /* defined XML_CONTEXT_BYTES */
    if (neededSize
        <= EXPAT_SAFE_PTR_DIFF(parser->m_bufferLim, parser->m_buffer)) {
#ifdef XML_CONTEXT_BYTES
      if (keep < EXPAT_SAFE_PTR_DIFF(parser->m_bufferPtr, parser->m_buffer)) {
        int offset
            = (int)EXPAT_SAFE_PTR_DIFF(parser->m_bufferPtr, parser->m_buffer)
              - keep;
        /* The buffer pointers cannot be NULL here; we have at least some bytes
         * in the buffer */
        memmove(parser->m_buffer, &parser->m_buffer[offset],
                parser->m_bufferEnd - parser->m_bufferPtr + keep);
        parser->m_bufferEnd -= offset;
        parser->m_bufferPtr -= offset;
      }
#else
      if (parser->m_buffer && parser->m_bufferPtr) {
        memmove(parser->m_buffer, parser->m_bufferPtr,
                EXPAT_SAFE_PTR_DIFF(parser->m_bufferEnd, parser->m_bufferPtr));
        parser->m_bufferEnd
            = parser->m_buffer
              + EXPAT_SAFE_PTR_DIFF(parser->m_bufferEnd, parser->m_bufferPtr);
        parser->m_bufferPtr = parser->m_buffer;
      }
#endif /* not defined XML_CONTEXT_BYTES */
    } else {
      char *newBuf;
      int bufferSize
          = (int)EXPAT_SAFE_PTR_DIFF(parser->m_bufferLim, parser->m_bufferPtr);
      if (bufferSize == 0)
        bufferSize = INIT_BUFFER_SIZE;
      do {
        /* Do not invoke signed arithmetic overflow: */
        bufferSize = (int)(2U * (unsigned)bufferSize);
      } while (bufferSize < neededSize && bufferSize > 0);
      if (bufferSize <= 0) {
        parser->m_errorCode = XML_ERROR_NO_MEMORY;
        return NULL;
      }
      newBuf = (char *)MALLOC(parser, bufferSize);
      if (newBuf == 0) {
        parser->m_errorCode = XML_ERROR_NO_MEMORY;
        return NULL;
      }
      parser->m_bufferLim = newBuf + bufferSize;
#ifdef XML_CONTEXT_BYTES
      if (parser->m_bufferPtr) {
        memcpy(newBuf, &parser->m_bufferPtr[-keep],
               EXPAT_SAFE_PTR_DIFF(parser->m_bufferEnd, parser->m_bufferPtr)
                   + keep);
        FREE(parser, parser->m_buffer);
        parser->m_buffer = newBuf;
        parser->m_bufferEnd
            = parser->m_buffer
              + EXPAT_SAFE_PTR_DIFF(parser->m_bufferEnd, parser->m_bufferPtr)
              + keep;
        parser->m_bufferPtr = parser->m_buffer + keep;
      } else {
        /* This must be a brand new buffer with no data in it yet */
        parser->m_bufferEnd = newBuf;
        parser->m_bufferPtr = parser->m_buffer = newBuf;
      }
#else
      if (parser->m_bufferPtr) {
        memcpy(newBuf, parser->m_bufferPtr,
               EXPAT_SAFE_PTR_DIFF(parser->m_bufferEnd, parser->m_bufferPtr));
        FREE(parser, parser->m_buffer);
        parser->m_bufferEnd
            = newBuf
              + EXPAT_SAFE_PTR_DIFF(parser->m_bufferEnd, parser->m_bufferPtr);
      } else {
        /* This must be a brand new buffer with no data in it yet */
        parser->m_bufferEnd = newBuf;
      }
      parser->m_bufferPtr = parser->m_buffer = newBuf;
#endif /* not defined XML_CONTEXT_BYTES */
    }
    parser->m_eventPtr = parser->m_eventEndPtr = NULL;
    parser->m_positionPtr = NULL;
  }
  return parser->m_bufferEnd;
}